

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

Template * __thiscall
ctemplate::TemplateCache::GetTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  Mutex *this_00;
  mapped_type *pmVar1;
  Template *pTVar2;
  RefcountedTemplate *refcounted_tpl;
  TemplateCacheKey cache_key;
  RefcountedTemplate *local_40;
  TemplateCacheKey local_38;
  
  local_38.first = TemplateString::GetGlobalId(filename);
  this_00 = this->mutex_;
  local_38.second = strip;
  Mutex::Lock(this_00);
  local_40 = GetTemplateLocked(this,filename,strip,&local_38);
  if (local_40 == (RefcountedTemplate *)0x0) {
    pTVar2 = (Template *)0x0;
  }
  else {
    RefcountedTemplate::IncRef(local_40);
    pmVar1 = std::__detail::
             _Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->get_template_calls_,&local_40);
    *pmVar1 = *pmVar1 + 1;
    pTVar2 = local_40->ptr_;
  }
  Mutex::Unlock(this_00);
  return pTVar2;
}

Assistant:

const Template *TemplateCache::GetTemplate(const TemplateString& filename,
                                           Strip strip) {
  // No need to have the cache-mutex acquired for this step
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  CachedTemplate retval;
  WriterMutexLock ml(mutex_);
  RefcountedTemplate* refcounted_tpl =
      GetTemplateLocked(filename, strip, cache_key);
  if (!refcounted_tpl)
    return NULL;

  refcounted_tpl->IncRef();   // DecRef() is in DoneWithGetTemplatePtrs()
  (*get_template_calls_)[refcounted_tpl]++;   // set up for DoneWith...()
  return refcounted_tpl->tpl();
}